

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O1

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::mutation(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
           *this)

{
  pointer pCVar1;
  pointer pGVar2;
  uint uVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  Chromosome<Gen,_ComputeFitness> *c;
  pointer pCVar6;
  Gen *gen;
  pointer pGVar7;
  float fVar8;
  mt19937 rng;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar5 = 1;
  uVar4 = local_2740._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
    local_2740._M_x[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_2740._M_p = 0x270;
  pCVar6 = (this->_fittestChromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->_fittestChromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar1) {
    do {
      pGVar2 = (pCVar6->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pGVar7 = (pCVar6->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                    super__Vector_impl_data._M_start; pGVar7 != pGVar2; pGVar7 = pGVar7 + 1) {
        fVar8 = std::
                generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&local_2740);
        if (this->_mutationFactor <= fVar8 && fVar8 != this->_mutationFactor) {
          (*(pGVar7->super_IGen)._vptr_IGen[2])
                    (pGVar7,(this->_data).
                            super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar1);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void mutation()
    {
        //Select a random crossover point
        std::random_device rd;                             // used once to initialise (seed) engine
        std::mt19937 rng(rd());                            // random-number engine used (Mersenne-Twister in this case)
        std::uniform_real_distribution<float> uni(0, 1.0); // guaranteed unbiased

        for (auto &c : _fittestChromosomes)
        {
            //Select if mutate this chromosome
            for (auto &gen : c.getGenes())
            {
                if (uni(rng) > _mutationFactor) // random mutation
                {
                    gen.mutate(_data.get());
                }
            }
        }

        //_population.mutate(_mutationFactor, _data.get());
    }